

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  tm *ptVar4;
  exception *anon_var_0_1;
  locale l;
  generator gen;
  char buf [1024];
  time_t now;
  char *locales_to_check [14];
  exception *anon_var_0;
  locale loc;
  char *clocale;
  info *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  generator *in_stack_fffffffffffffa08;
  allocator *__loc;
  char **in_stack_fffffffffffffa60;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  locale local_508 [8];
  generator local_500 [8];
  char local_4f8 [936];
  string *in_stack_fffffffffffffeb0;
  time_t local_f8;
  allocator local_e9;
  string local_e8 [32];
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  undefined8 uStack_60;
  string local_48 [48];
  locale local_18 [8];
  char *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  std::operator<<((ostream *)&std::cout,"- Backends: ");
  poVar2 = std::operator<<((ostream *)&std::cout,"icu:");
  poVar2 = std::operator<<(poVar2,"70.1");
  std::operator<<(poVar2," ");
  std::operator<<((ostream *)&std::cout,"std ");
  std::operator<<((ostream *)&std::cout,"posix ");
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"- With iconv");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Environment ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  LANG=");
  pcVar3 = env((char *)in_stack_fffffffffffff9f8);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  LC_ALL=");
  pcVar3 = env((char *)in_stack_fffffffffffff9f8);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  LC_CTYPE=");
  pcVar3 = env((char *)in_stack_fffffffffffff9f8);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  TZ=");
  pcVar3 = env((char *)in_stack_fffffffffffff9f8);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_10 = setlocale(6,"");
  if (local_10 == (char *)0x0) {
    local_10 = "undetected";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- C locale: ");
  poVar2 = std::operator<<(poVar2,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::locale::locale(local_18,"");
  poVar2 = std::operator<<((ostream *)&std::cout,"- C++ locale: ");
  std::locale::name_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_48);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  std::locale::~locale(local_18);
  local_68 = "Japanese_Japan.932";
  uStack_60 = 0;
  local_78 = "ja_JP.UTF-8";
  pcStack_70 = "ja_JP.SJIS";
  local_88 = "tr_TR.UTF-8";
  pcStack_80 = "Turkish_Turkey.1254";
  local_98 = "ru_RU.UTF-8";
  pcStack_90 = "Russian_Russia.1251";
  local_a8 = "he_IL.ISO8859-8";
  pcStack_a0 = "Hebrew_Israel.1255";
  local_b8 = "English_United States.1252";
  pcStack_b0 = "he_IL.UTF-8";
  local_c8 = "en_US.UTF-8";
  pcStack_c0 = "en_US.ISO8859-1";
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "- Testing locales availability on the operation system:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  check_locale(in_stack_fffffffffffffa60);
  poVar2 = std::operator<<((ostream *)&std::cout,"--- Testing Japanese_Japan.932 is working: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Japanese_Japan.932",&local_e9);
  bVar1 = test_std_supports_SJIS_codecvt(in_stack_fffffffffffffeb0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing timezone and time ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  setlocale(6,"C");
  local_f8 = time((time_t *)0x0);
  ptVar4 = localtime(&local_f8);
  strftime(local_4f8,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar4);
  poVar2 = std::operator<<((ostream *)&std::cout,"  Local Time    :");
  poVar2 = std::operator<<(poVar2,local_4f8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ptVar4 = gmtime(&local_f8);
  strftime(local_4f8,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar4);
  poVar2 = std::operator<<((ostream *)&std::cout,"  Universal Time:");
  poVar2 = std::operator<<(poVar2,local_4f8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"- Boost.Locale\'s locale: ");
  booster::locale::generator::generator(local_500);
  __loc = &local_529;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"",__loc);
  booster::locale::generator::operator()(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::use_facet<booster::locale::info>((locale *)__loc);
  booster::locale::info::name_abi_cxx11_(in_stack_fffffffffffff9f8);
  poVar2 = std::operator<<((ostream *)&std::cout,local_550);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_550);
  std::locale::~locale(local_508);
  booster::locale::generator::~generator(local_500);
  return 0;
}

Assistant:

int main()
{
    std::cout << "- Backends: ";
    #ifdef BOOSTER_LOCALE_WITH_ICU
    std::cout << "icu:" << U_ICU_VERSION << " ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_STD_BACKEND
    std::cout << "std ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_POSIX_BACKEND
    std::cout << "posix ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_WINAPI_BACKEND
    std::cout << "winapi";
    #endif
    std::cout << std::endl;
    #ifdef BOOSTER_LOCALE_WITH_ICONV
    std::cout << "- With iconv" << std::endl;
    #else
    std::cout << "- Without iconv" << std::endl;
    #endif
    std::cout << "- Environment " << std::endl;
    std::cout << "  LANG="<< env("LANG") << std::endl;
    std::cout << "  LC_ALL="<< env("LC_ALL") << std::endl;
    std::cout << "  LC_CTYPE="<< env("LC_CTYPE") << std::endl;
    std::cout << "  TZ="<< env("TZ") << std::endl;

    char const *clocale=setlocale(LC_ALL,"");
    if(!clocale)
        clocale= "undetected";
    std::cout <<"- C locale: " << clocale << std::endl;

    try {
        std::locale loc("");
        std::cout << "- C++ locale: " << loc.name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << "- C++ locale: is not supported" << std::endl;
    }

    char const *locales_to_check[] = {
        "en_US.UTF-8", "en_US.ISO8859-1", "English_United States.1252",
        "he_IL.UTF-8", "he_IL.ISO8859-8", "Hebrew_Israel.1255",
        "ru_RU.UTF-8", "Russian_Russia.1251",
        "tr_TR.UTF-8", "Turkish_Turkey.1254",
        "ja_JP.UTF-8", "ja_JP.SJIS", "Japanese_Japan.932",
        0
    };
    std::cout << "- Testing locales availability on the operation system:" << std::endl;
    check_locale(locales_to_check);
    std::cout << "--- Testing Japanese_Japan.932 is working: " << test_std_supports_SJIS_codecvt("Japanese_Japan.932") << std::endl;

    std::cout << "- Testing timezone and time " << std::endl;
    {
        setlocale(LC_ALL,"C");
        time_t now = time(0);
        char buf[1024];
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",localtime(&now));
        std::cout << "  Local Time    :" << buf << std::endl;
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",gmtime(&now));
        std::cout << "  Universal Time:" << buf << std::endl;
    }
    std::cout << "- Boost.Locale's locale: ";
    try {
        booster::locale::generator gen;
        std::locale l = gen("");
        std::cout << std::use_facet<booster::locale::info>(l).name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << " undetected" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;

}